

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void atomtab_d(disctx *ctx,ull *a,ull *m,void *v)

{
  int iVar1;
  bool bVar2;
  uint local_34;
  ulong *puStack_30;
  int i;
  insn *tab;
  void *v_local;
  ull *m_local;
  ull *a_local;
  disctx *ctx_local;
  
  puStack_30 = (ulong *)v;
  while( true ) {
    bVar2 = true;
    if ((*a & puStack_30[1]) == *puStack_30) {
      iVar1 = var_ok((int)puStack_30[0x62],*(int *)((long)puStack_30 + 0x314),ctx->varinfo);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    puStack_30 = puStack_30 + 99;
  }
  *m = puStack_30[1] | *m;
  for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
    if (puStack_30[(long)(int)local_34 * 3 + 3] != 0) {
      (*(code *)puStack_30[(long)(int)local_34 * 3 + 3])
                (ctx,a,m,puStack_30[(long)(int)local_34 * 3 + 4]);
    }
  }
  return;
}

Assistant:

void atomtab_d DPROTO {
	const struct insn *tab = v;
	int i;
	while ((a[0]&tab->mask) != tab->val || !var_ok(tab->fmask, tab->ptype, ctx->varinfo))
		tab++;
	m[0] |= tab->mask;
	for (i = 0; i < ARRAY_SIZE(tab->atoms); i++)
		if (tab->atoms[i].fun_dis)
			tab->atoms[i].fun_dis (ctx, a, m, tab->atoms[i].arg);
}